

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cc
# Opt level: O0

void __thiscall wabt::Features::AddOptions(Features *this,OptionParser *parser)

{
  OptionParser *pOVar1;
  anon_class_8_1_8991fb9c local_220;
  NullCallback local_218;
  anon_class_8_1_8991fb9c local_1f8;
  NullCallback local_1f0;
  anon_class_8_1_8991fb9c local_1d0;
  NullCallback local_1c8;
  anon_class_8_1_8991fb9c local_1a8;
  NullCallback local_1a0;
  anon_class_8_1_8991fb9c local_180;
  NullCallback local_178;
  anon_class_8_1_8991fb9c local_158;
  NullCallback local_150;
  anon_class_8_1_8991fb9c local_130;
  NullCallback local_128;
  anon_class_8_1_8991fb9c local_108;
  NullCallback local_100;
  anon_class_8_1_8991fb9c local_e0;
  NullCallback local_d8;
  anon_class_8_1_8991fb9c local_b8;
  NullCallback local_b0;
  anon_class_8_1_8991fb9c local_90;
  NullCallback local_88;
  anon_class_8_1_8991fb9c local_68;
  NullCallback local_60;
  anon_class_8_1_8991fb9c local_40;
  NullCallback local_38;
  OptionParser *local_18;
  OptionParser *parser_local;
  Features *this_local;
  
  local_40.this = this;
  local_18 = parser;
  parser_local = (OptionParser *)this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__1,void>
            ((function<void()> *)&local_38,&local_40);
  OptionParser::AddOption
            (parser,"enable-exceptions","Enable Experimental exception handling",&local_38);
  std::function<void_()>::~function(&local_38);
  pOVar1 = local_18;
  local_68.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__2,void>
            ((function<void()> *)&local_60,&local_68);
  OptionParser::AddOption
            (pOVar1,"disable-mutable-globals","Disable Import/export mutable globals",&local_60);
  std::function<void_()>::~function(&local_60);
  pOVar1 = local_18;
  local_90.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__5,void>
            ((function<void()> *)&local_88,&local_90);
  OptionParser::AddOption
            (pOVar1,"enable-saturating-float-to-int","Enable Saturating float-to-int operators",
             &local_88);
  std::function<void_()>::~function(&local_88);
  pOVar1 = local_18;
  local_b8.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__7,void>
            ((function<void()> *)&local_b0,&local_b8);
  OptionParser::AddOption
            (pOVar1,"enable-sign-extension","Enable Sign-extension operators",&local_b0);
  std::function<void_()>::~function(&local_b0);
  pOVar1 = local_18;
  local_e0.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__9,void>
            ((function<void()> *)&local_d8,&local_e0);
  OptionParser::AddOption(pOVar1,"enable-simd","Enable SIMD support",&local_d8);
  std::function<void_()>::~function(&local_d8);
  pOVar1 = local_18;
  local_108.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__11,void>
            ((function<void()> *)&local_100,&local_108);
  OptionParser::AddOption(pOVar1,"enable-threads","Enable Threading support",&local_100);
  std::function<void_()>::~function(&local_100);
  pOVar1 = local_18;
  local_130.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__13,void>
            ((function<void()> *)&local_128,&local_130);
  OptionParser::AddOption(pOVar1,"enable-multi-value","Enable Multi-value",&local_128);
  std::function<void_()>::~function(&local_128);
  pOVar1 = local_18;
  local_158.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__15,void>
            ((function<void()> *)&local_150,&local_158);
  OptionParser::AddOption(pOVar1,"enable-tail-call","Enable Tail-call support",&local_150);
  std::function<void_()>::~function(&local_150);
  pOVar1 = local_18;
  local_180.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__17,void>
            ((function<void()> *)&local_178,&local_180);
  OptionParser::AddOption(pOVar1,"enable-bulk-memory","Enable Bulk-memory operations",&local_178);
  std::function<void_()>::~function(&local_178);
  pOVar1 = local_18;
  local_1a8.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__19,void>
            ((function<void()> *)&local_1a0,&local_1a8);
  OptionParser::AddOption
            (pOVar1,"enable-reference-types","Enable Reference types (anyref)",&local_1a0);
  std::function<void_()>::~function(&local_1a0);
  pOVar1 = local_18;
  local_1d0.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__21,void>
            ((function<void()> *)&local_1c8,&local_1d0);
  OptionParser::AddOption(pOVar1,"enable-annotations","Enable Custom annotation syntax",&local_1c8);
  std::function<void_()>::~function(&local_1c8);
  pOVar1 = local_18;
  local_1f8.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__23,void>
            ((function<void()> *)&local_1f0,&local_1f8);
  OptionParser::AddOption(pOVar1,"enable-gc","Enable Garbage collection",&local_1f0);
  std::function<void_()>::~function(&local_1f0);
  pOVar1 = local_18;
  local_220.this = this;
  std::function<void()>::function<wabt::Features::AddOptions(wabt::OptionParser*)::__24,void>
            ((function<void()> *)&local_218,&local_220);
  OptionParser::AddOption(pOVar1,"enable-all","Enable all features",&local_218);
  std::function<void_()>::~function(&local_218);
  return;
}

Assistant:

void Features::AddOptions(OptionParser* parser) {
#define WABT_FEATURE(variable, flag, default_, help)       \
  if (default_ == true) {                                  \
    parser->AddOption("disable-" flag, "Disable " help,    \
                      [this]() { disable_##variable(); }); \
  } else {                                                 \
    parser->AddOption("enable-" flag, "Enable " help,      \
                      [this]() { enable_##variable(); });  \
  }

#include "src/feature.def"
#undef WABT_FEATURE
  parser->AddOption("enable-all", "Enable all features",
                    [this]() { EnableAll(); });
}